

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall
Chainstate::FlushStateToDisk
          (Chainstate *this,BlockValidationState *state,FlushStateMode mode,int nManualPruneHeight)

{
  long lVar1;
  CoinsViews *pCVar2;
  Notifications *pNVar3;
  ChainstateManager *pCVar4;
  ValidationSignals *this_00;
  BlockTreeDB *this_01;
  string prefix;
  string prefix_00;
  string prefix_01;
  string prefix_02;
  string prefix_03;
  string prefix_04;
  string end_msg;
  string end_msg_00;
  string end_msg_01;
  string end_msg_02;
  string end_msg_03;
  string end_msg_04;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  CoinsCacheSizeState CVar10;
  int iVar11;
  ChainstateRole role;
  CCoinsViewCache *pCVar12;
  size_t sVar13;
  long lVar14;
  undefined8 extraout_RAX;
  long lVar15;
  byte bVar16;
  long lVar17;
  unsigned_long *args_1;
  byte bVar18;
  byte bVar19;
  __node_base *p_Var20;
  long in_FS_OFFSET;
  bool bVar21;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  undefined1 in_stack_fffffffffffffd18 [15];
  undefined1 in_stack_fffffffffffffd27;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 uVar22;
  undefined8 in_stack_fffffffffffffd30;
  undefined4 uStack_2b8;
  int last_prune;
  size_t coins_count;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock12;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock11;
  string local_288;
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  limiting_lock;
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> logging_timer13;
  set<int,_std::less<int>,_std::allocator<int>_> setFilesToPrune;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock11,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
             ,0xade,false);
  pCVar2 = (this->m_coins_views)._M_t.
           super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>._M_t.
           super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
           super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl;
  if ((pCVar2 == (CoinsViews *)0x0) ||
     ((_Head_base<0UL,_CCoinsViewCache_*,_false>)
      *(_Tuple_impl<0UL,_CCoinsViewCache_*,_std::default_delete<CCoinsViewCache>_> *)
       &(pCVar2->m_cacheview)._M_t.
        super___uniq_ptr_impl<CCoinsViewCache,_std::default_delete<CCoinsViewCache>_> ==
      (CCoinsViewCache *)0x0)) {
    __assert_fail("this->CanFlushToDisk()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0xadf,
                  "bool Chainstate::FlushStateToDisk(BlockValidationState &, FlushStateMode, int)");
  }
  setFilesToPrune._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &setFilesToPrune._M_t._M_impl.super__Rb_tree_header._M_header;
  setFilesToPrune._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  setFilesToPrune._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  setFilesToPrune._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  setFilesToPrune._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       setFilesToPrune._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pCVar12 = CoinsTip(this);
  uVar9 = CCoinsViewCache::GetCacheSize(pCVar12);
  coins_count = (size_t)uVar9;
  pCVar12 = CoinsTip(this);
  sVar13 = CCoinsViewCache::DynamicMemoryUsage(pCVar12);
  CVar10 = GetCoinsCacheSizeState(this);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock12,&this->m_blockman->cs_LastBlockFile,"m_blockman.cs_LastBlockFile",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
             ,0xaec,false);
  if ((this->m_blockman->m_prune_mode == true) &&
     (((0 < nManualPruneHeight || (this->m_blockman->m_check_for_pruning != false)) &&
      (((this->m_chainman->m_blockman).m_blockfiles_indexed._M_base._M_i & 1U) != 0)))) {
    last_prune = (int)((ulong)((long)(this->m_chain).vChain.
                                     super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->m_chain).vChain.
                                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    limiting_lock.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    p_Var20 = &(this->m_blockman->m_prune_locks)._M_h._M_before_begin;
    while (p_Var20 = p_Var20->_M_nxt, p_Var20 != (__node_base *)0x0) {
      if (*(int *)&p_Var20[5]._M_nxt != 0x7fffffff) {
        iVar11 = *(int *)&p_Var20[5]._M_nxt + -0xb;
        if (iVar11 < last_prune) {
          last_prune = iVar11;
        }
        if (last_prune < 2) {
          last_prune = 1;
        }
        if (last_prune == iVar11) {
          std::optional<std::__cxx11::string>::operator=
                    ((optional<std::__cxx11::string> *)&limiting_lock,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var20 + 1));
        }
      }
    }
    if (limiting_lock.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged != false) {
      bVar8 = ::LogAcceptCategory(PRUNE,Debug);
      if (bVar8) {
        if (limiting_lock.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged == false) {
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            std::__throw_bad_optional_access();
          }
          goto LAB_0035a11c;
        }
        logging_function_00._M_str = "FlushStateToDisk";
        logging_function_00._M_len = 0x10;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file_00._M_len = 0x5e;
        LogPrintFormatInternal<std::__cxx11::string,int>
                  (logging_function_00,source_file_00,0xafe,PRUNE,Debug,
                   (ConstevalFormatString<2U>)0x6c3c1d,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &limiting_lock,&last_prune);
      }
    }
    if (nManualPruneHeight < 1) {
      std::__cxx11::string::string<std::allocator<char>>
                (local_128,"FlushStateToDisk",(allocator<char> *)((long)&uStack_2b8 + 3));
      std::__cxx11::string::string<std::allocator<char>>
                (local_148,"find files to prune",(allocator<char> *)((long)&uStack_2b8 + 2));
      prefix_04._M_string_length._7_1_ = in_stack_fffffffffffffd27;
      prefix_04._0_15_ = in_stack_fffffffffffffd18;
      prefix_04.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffd28;
      prefix_04.field_2._M_allocated_capacity._4_4_ = mode;
      prefix_04.field_2._8_8_ = in_stack_fffffffffffffd30;
      end_msg_04._M_string_length = sVar13;
      end_msg_04._M_dataplus._M_p = (pointer)state;
      end_msg_04.field_2._M_allocated_capacity._0_4_ = uStack_2b8;
      end_msg_04.field_2._M_allocated_capacity._4_4_ = last_prune;
      end_msg_04.field_2._8_8_ = coins_count;
      BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
                (&logging_timer13,prefix_04,end_msg_04,(LogFlags)local_128,SUB81(local_148,0));
      std::__cxx11::string::~string(local_148);
      std::__cxx11::string::~string(local_128);
      ::node::BlockManager::FindFilesToPrune
                (this->m_blockman,&setFilesToPrune,last_prune,this,this->m_chainman);
      this->m_blockman->m_check_for_pruning = false;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                (local_e8,"FlushStateToDisk",(allocator<char> *)((long)&uStack_2b8 + 3));
      std::__cxx11::string::string<std::allocator<char>>
                (local_108,"find files to prune (manual)",(allocator<char> *)((long)&uStack_2b8 + 2)
                );
      prefix_03._M_string_length._7_1_ = in_stack_fffffffffffffd27;
      prefix_03._0_15_ = in_stack_fffffffffffffd18;
      prefix_03.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffd28;
      prefix_03.field_2._M_allocated_capacity._4_4_ = mode;
      prefix_03.field_2._8_8_ = in_stack_fffffffffffffd30;
      end_msg_03._M_string_length = sVar13;
      end_msg_03._M_dataplus._M_p = (pointer)state;
      end_msg_03.field_2._M_allocated_capacity._0_4_ = uStack_2b8;
      end_msg_03.field_2._M_allocated_capacity._4_4_ = last_prune;
      end_msg_03.field_2._8_8_ = coins_count;
      BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
                (&logging_timer13,prefix_03,end_msg_03,(LogFlags)local_e8,SUB81(local_108,0));
      std::__cxx11::string::~string(local_108);
      std::__cxx11::string::~string(local_e8);
      if (last_prune < nManualPruneHeight) {
        nManualPruneHeight = last_prune;
      }
      ::node::BlockManager::FindFilesToPruneManual
                (this->m_blockman,&setFilesToPrune,nManualPruneHeight,this,this->m_chainman);
    }
    BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer(&logging_timer13);
    uVar22 = (undefined4)
             CONCAT71((int7)((ulong)extraout_RAX >> 8),
                      setFilesToPrune._M_t._M_impl.super__Rb_tree_header._M_node_count != 0);
    if ((setFilesToPrune._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
       (this->m_blockman->m_have_pruned == false)) {
      this_01 = (this->m_blockman->m_block_tree_db)._M_t.
                super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
                ._M_t.
                super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
                .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&logging_timer13,"prunedblockfiles",
                 (allocator<char> *)((long)&uStack_2b8 + 3));
      kernel::BlockTreeDB::WriteFlag(this_01,(string *)&logging_timer13,true);
      std::__cxx11::string::~string((string *)&logging_timer13);
      this->m_blockman->m_have_pruned = true;
    }
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&limiting_lock);
  }
  else {
    uVar22 = 0;
  }
  lVar14 = std::chrono::_V2::steady_clock::now();
  lVar17 = (this->m_last_write).__d.__r;
  if (lVar17 == 0) {
    (this->m_last_write).__d.__r = lVar14;
    lVar17 = lVar14;
  }
  lVar15 = (this->m_last_flush).__d.__r;
  if (lVar15 == 0) {
    (this->m_last_flush).__d.__r = lVar14;
    lVar15 = lVar14;
  }
  bVar8 = mode == PERIODIC;
  bVar21 = CVar10 != OK;
  bVar5 = LARGE < CVar10 && mode == IF_NEEDED;
  bVar18 = 1;
  if ((((mode == ALWAYS || bVar21 && bVar8) || LARGE < CVar10 && mode == IF_NEEDED) ||
      (bVar18 = (lVar15 + 86400000000000 < lVar14 && mode == PERIODIC) | (byte)uVar22,
      mode == PERIODIC && lVar17 + 3600000000000 < lVar14)) || (bVar18 != 0)) {
    bVar6 = CheckDiskSpace(&(this->m_blockman->m_opts).blocks_dir,0);
    if (bVar6) {
      CVar10 = 0x6c3d7d;
      std::__cxx11::string::string<std::allocator<char>>
                (local_168,"FlushStateToDisk",(allocator<char> *)&limiting_lock);
      std::__cxx11::string::string<std::allocator<char>>
                (local_188,"write block and undo data to disk",(allocator<char> *)&last_prune);
      prefix._M_string_length._7_1_ = bVar5;
      prefix._0_15_ = in_stack_fffffffffffffd18;
      prefix.field_2._M_allocated_capacity._0_4_ = uVar22;
      prefix.field_2._M_allocated_capacity._4_4_ = mode;
      prefix.field_2._8_8_ = lVar14;
      end_msg._M_string_length = sVar13;
      end_msg._M_dataplus._M_p = (pointer)state;
      end_msg.field_2._M_allocated_capacity._0_4_ = uStack_2b8;
      end_msg.field_2._M_allocated_capacity._4_4_ = last_prune;
      end_msg.field_2._8_8_ = coins_count;
      BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
                (&logging_timer13,prefix,end_msg,(LogFlags)local_168,SUB81(local_188,0));
      std::__cxx11::string::~string(local_188);
      std::__cxx11::string::~string(local_168);
      bVar6 = ::node::BlockManager::FlushChainstateBlockFile
                        (this->m_blockman,
                         (int)((ulong)((long)(this->m_chain).vChain.
                                             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->m_chain).vChain.
                                            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1);
      if (!bVar6) {
        bVar6 = ::LogAcceptCategory(VALIDATION,Warning);
        if (bVar6) {
          logging_function._M_str = "FlushStateToDisk";
          logging_function._M_len = 0x10;
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file._M_len = 0x5e;
          LogPrintFormatInternal<char[17]>
                    (logging_function,source_file,0xb35,VALIDATION,Warning,
                     (ConstevalFormatString<1U>)0x6c3c91,(char (*) [17])0x6c3d7d);
        }
      }
      BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer(&logging_timer13);
      std::__cxx11::string::string<std::allocator<char>>
                (local_1a8,"FlushStateToDisk",(allocator<char> *)&limiting_lock);
      std::__cxx11::string::string<std::allocator<char>>
                (local_1c8,"write block index to disk",(allocator<char> *)&last_prune);
      args_1 = (unsigned_long *)&DAT_00000001;
      prefix_00._M_string_length._7_1_ = bVar5;
      prefix_00._0_15_ = in_stack_fffffffffffffd18;
      prefix_00.field_2._M_allocated_capacity._0_4_ = uVar22;
      prefix_00.field_2._M_allocated_capacity._4_4_ = mode;
      prefix_00.field_2._8_8_ = lVar14;
      end_msg_00._M_string_length = sVar13;
      end_msg_00._M_dataplus._M_p = (pointer)state;
      end_msg_00.field_2._M_allocated_capacity._0_4_ = uStack_2b8;
      end_msg_00.field_2._M_allocated_capacity._4_4_ = last_prune;
      end_msg_00.field_2._8_8_ = coins_count;
      BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
                (&logging_timer13,prefix_00,end_msg_00,(LogFlags)local_1a8,SUB81(local_1c8,0));
      std::__cxx11::string::~string(local_1c8);
      std::__cxx11::string::~string(local_1a8);
      bVar6 = ::node::BlockManager::WriteBlockIndexDB(this->m_blockman);
      if (!bVar6) {
        pNVar3 = (this->m_chainman->m_options).notifications;
        _((bilingual_str *)&limiting_lock,(ConstevalStringLiteral)0x6c3ccc);
        bVar7 = FatalError(pNVar3,state,(bilingual_str *)&limiting_lock);
        CVar10 = (CoinsCacheSizeState)bVar7;
        bilingual_str::~bilingual_str((bilingual_str *)&limiting_lock);
      }
      bVar19 = (byte)CVar10;
      BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer(&logging_timer13);
      bVar16 = 1;
      if (bVar6) {
        if ((char)uVar22 != '\0') {
          std::__cxx11::string::string<std::allocator<char>>
                    (local_228,"FlushStateToDisk",(allocator<char> *)&limiting_lock);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_248,"unlink pruned files",(allocator<char> *)&last_prune);
          args_1 = (unsigned_long *)&DAT_00000001;
          prefix_01._M_string_length._7_1_ = bVar5;
          prefix_01._0_15_ = in_stack_fffffffffffffd18;
          prefix_01.field_2._M_allocated_capacity._0_4_ = uVar22;
          prefix_01.field_2._M_allocated_capacity._4_4_ = mode;
          prefix_01.field_2._8_8_ = lVar14;
          end_msg_01._M_string_length = sVar13;
          end_msg_01._M_dataplus._M_p = (pointer)state;
          end_msg_01.field_2._M_allocated_capacity._0_4_ = uStack_2b8;
          end_msg_01.field_2._M_allocated_capacity._4_4_ = last_prune;
          end_msg_01.field_2._8_8_ = coins_count;
          BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
                    (&logging_timer13,prefix_01,end_msg_01,(LogFlags)local_228,SUB81(local_248,0));
          std::__cxx11::string::~string(local_248);
          std::__cxx11::string::~string(local_228);
          ::node::BlockManager::UnlinkPrunedFiles(this->m_blockman,&setFilesToPrune);
          BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer
                    (&logging_timer13);
        }
        (this->m_last_write).__d.__r = lVar14;
        if (bVar18 == 0) goto LAB_00359925;
        pCVar12 = CoinsTip(this);
        (*(pCVar12->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[2])
                  (&logging_timer13,pCVar12);
        bVar6 = base_blob<256U>::IsNull((base_blob<256U> *)&logging_timer13);
        if (bVar6) goto LAB_00359928;
        std::__cxx11::string::string<std::allocator<char>>
                  (local_268,"FlushStateToDisk",(allocator<char> *)&last_prune);
        limiting_lock.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(sVar13 / 1000);
        tinyformat::format<unsigned_long,unsigned_long>
                  (&local_288,(tinyformat *)"write coins cache to disk (%d coins, %.2fkB)",
                   (char *)&coins_count,(unsigned_long *)&limiting_lock,args_1);
        prefix_02._M_string_length._7_1_ = bVar5;
        prefix_02._0_15_ = in_stack_fffffffffffffd18;
        prefix_02.field_2._M_allocated_capacity._0_4_ = uVar22;
        prefix_02.field_2._M_allocated_capacity._4_4_ = mode;
        prefix_02.field_2._8_8_ = lVar14;
        end_msg_02._M_string_length = sVar13;
        end_msg_02._M_dataplus._M_p = (pointer)state;
        end_msg_02.field_2._M_allocated_capacity._0_4_ = uStack_2b8;
        end_msg_02.field_2._M_allocated_capacity._4_4_ = last_prune;
        end_msg_02.field_2._8_8_ = coins_count;
        BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
                  (&logging_timer13,prefix_02,end_msg_02,(LogFlags)local_268,SUB81(&local_288,0));
        std::__cxx11::string::~string((string *)&local_288);
        std::__cxx11::string::~string(local_268);
        pCVar4 = this->m_chainman;
        pCVar12 = CoinsTip(this);
        uVar9 = CCoinsViewCache::GetCacheSize(pCVar12);
        bVar6 = CheckDiskSpace(&(pCVar4->m_options).datadir,(ulong)(uVar9 * 0xc0));
        if (bVar6) {
          if ((mode != ALWAYS & (((bVar21 && bVar8) | bVar5) ^ 1)) == 0) {
            pCVar12 = CoinsTip(this);
            bVar8 = CCoinsViewCache::Flush(pCVar12);
          }
          else {
            pCVar12 = CoinsTip(this);
            bVar8 = CCoinsViewCache::Sync(pCVar12);
          }
          if (bVar8 == false) {
            pNVar3 = (this->m_chainman->m_options).notifications;
            _((bilingual_str *)&limiting_lock,(ConstevalStringLiteral)0x6c3d36);
            bVar19 = FatalError(pNVar3,state,(bilingual_str *)&limiting_lock);
            goto LAB_00359cd6;
          }
          (this->m_last_flush).__d.__r = lVar14;
          bVar5 = 0;
        }
        else {
          pNVar3 = (this->m_chainman->m_options).notifications;
          _((bilingual_str *)&limiting_lock,(ConstevalStringLiteral)0x68d594);
          bVar19 = FatalError(pNVar3,state,(bilingual_str *)&limiting_lock);
LAB_00359cd6:
          bilingual_str::~bilingual_str((bilingual_str *)&limiting_lock);
          bVar5 = 1;
        }
        BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer(&logging_timer13)
        ;
        bVar16 = bVar5;
      }
      else {
        bVar5 = 1;
      }
    }
    else {
      pNVar3 = (this->m_chainman->m_options).notifications;
      _((bilingual_str *)&logging_timer13,(ConstevalStringLiteral)0x68d594);
      bVar19 = FatalError(pNVar3,state,(bilingual_str *)&logging_timer13);
      bilingual_str::~bilingual_str((bilingual_str *)&logging_timer13);
      bVar5 = 1;
      bVar16 = 1;
    }
  }
  else {
LAB_00359925:
    bVar19 = (byte)CVar10;
LAB_00359928:
    bVar16 = 1;
    bVar5 = 0;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock12.super_unique_lock);
  if (bVar16 == 0 && bVar5 == 0) {
    this_00 = (this->m_chainman->m_options).signals;
    bVar19 = 1;
    if (this_00 != (ValidationSignals *)0x0) {
      role = GetRole(this);
      CChain::GetLocator((CBlockLocator *)&logging_timer13,&this->m_chain);
      ValidationSignals::ChainStateFlushed(this_00,role,(CBlockLocator *)&logging_timer13);
      std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
                ((_Vector_base<uint256,_std::allocator<uint256>_> *)&logging_timer13);
    }
  }
  else {
    bVar19 = bVar19 | bVar5 ^ 1;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&setFilesToPrune._M_t);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock11.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar19 & 1);
  }
LAB_0035a11c:
  __stack_chk_fail();
}

Assistant:

bool Chainstate::FlushStateToDisk(
    BlockValidationState &state,
    FlushStateMode mode,
    int nManualPruneHeight)
{
    LOCK(cs_main);
    assert(this->CanFlushToDisk());
    std::set<int> setFilesToPrune;
    bool full_flush_completed = false;

    const size_t coins_count = CoinsTip().GetCacheSize();
    const size_t coins_mem_usage = CoinsTip().DynamicMemoryUsage();

    try {
    {
        bool fFlushForPrune = false;
        bool fDoFullFlush = false;

        CoinsCacheSizeState cache_state = GetCoinsCacheSizeState();
        LOCK(m_blockman.cs_LastBlockFile);
        if (m_blockman.IsPruneMode() && (m_blockman.m_check_for_pruning || nManualPruneHeight > 0) && m_chainman.m_blockman.m_blockfiles_indexed) {
            // make sure we don't prune above any of the prune locks bestblocks
            // pruning is height-based
            int last_prune{m_chain.Height()}; // last height we can prune
            std::optional<std::string> limiting_lock; // prune lock that actually was the limiting factor, only used for logging

            for (const auto& prune_lock : m_blockman.m_prune_locks) {
                if (prune_lock.second.height_first == std::numeric_limits<int>::max()) continue;
                // Remove the buffer and one additional block here to get actual height that is outside of the buffer
                const int lock_height{prune_lock.second.height_first - PRUNE_LOCK_BUFFER - 1};
                last_prune = std::max(1, std::min(last_prune, lock_height));
                if (last_prune == lock_height) {
                    limiting_lock = prune_lock.first;
                }
            }

            if (limiting_lock) {
                LogDebug(BCLog::PRUNE, "%s limited pruning to height %d\n", limiting_lock.value(), last_prune);
            }

            if (nManualPruneHeight > 0) {
                LOG_TIME_MILLIS_WITH_CATEGORY("find files to prune (manual)", BCLog::BENCH);

                m_blockman.FindFilesToPruneManual(
                    setFilesToPrune,
                    std::min(last_prune, nManualPruneHeight),
                    *this, m_chainman);
            } else {
                LOG_TIME_MILLIS_WITH_CATEGORY("find files to prune", BCLog::BENCH);

                m_blockman.FindFilesToPrune(setFilesToPrune, last_prune, *this, m_chainman);
                m_blockman.m_check_for_pruning = false;
            }
            if (!setFilesToPrune.empty()) {
                fFlushForPrune = true;
                if (!m_blockman.m_have_pruned) {
                    m_blockman.m_block_tree_db->WriteFlag("prunedblockfiles", true);
                    m_blockman.m_have_pruned = true;
                }
            }
        }
        const auto nNow{SteadyClock::now()};
        // Avoid writing/flushing immediately after startup.
        if (m_last_write == decltype(m_last_write){}) {
            m_last_write = nNow;
        }
        if (m_last_flush == decltype(m_last_flush){}) {
            m_last_flush = nNow;
        }
        // The cache is large and we're within 10% and 10 MiB of the limit, but we have time now (not in the middle of a block processing).
        bool fCacheLarge = mode == FlushStateMode::PERIODIC && cache_state >= CoinsCacheSizeState::LARGE;
        // The cache is over the limit, we have to write now.
        bool fCacheCritical = mode == FlushStateMode::IF_NEEDED && cache_state >= CoinsCacheSizeState::CRITICAL;
        // It's been a while since we wrote the block index to disk. Do this frequently, so we don't need to redownload after a crash.
        bool fPeriodicWrite = mode == FlushStateMode::PERIODIC && nNow > m_last_write + DATABASE_WRITE_INTERVAL;
        // It's been very long since we flushed the cache. Do this infrequently, to optimize cache usage.
        bool fPeriodicFlush = mode == FlushStateMode::PERIODIC && nNow > m_last_flush + DATABASE_FLUSH_INTERVAL;
        // Combine all conditions that result in a full cache flush.
        fDoFullFlush = (mode == FlushStateMode::ALWAYS) || fCacheLarge || fCacheCritical || fPeriodicFlush || fFlushForPrune;
        // Write blocks and block index to disk.
        if (fDoFullFlush || fPeriodicWrite) {
            // Ensure we can write block index
            if (!CheckDiskSpace(m_blockman.m_opts.blocks_dir)) {
                return FatalError(m_chainman.GetNotifications(), state, _("Disk space is too low!"));
            }
            {
                LOG_TIME_MILLIS_WITH_CATEGORY("write block and undo data to disk", BCLog::BENCH);

                // First make sure all block and undo data is flushed to disk.
                // TODO: Handle return error, or add detailed comment why it is
                // safe to not return an error upon failure.
                if (!m_blockman.FlushChainstateBlockFile(m_chain.Height())) {
                    LogPrintLevel(BCLog::VALIDATION, BCLog::Level::Warning, "%s: Failed to flush block file.\n", __func__);
                }
            }

            // Then update all block file information (which may refer to block and undo files).
            {
                LOG_TIME_MILLIS_WITH_CATEGORY("write block index to disk", BCLog::BENCH);

                if (!m_blockman.WriteBlockIndexDB()) {
                    return FatalError(m_chainman.GetNotifications(), state, _("Failed to write to block index database."));
                }
            }
            // Finally remove any pruned files
            if (fFlushForPrune) {
                LOG_TIME_MILLIS_WITH_CATEGORY("unlink pruned files", BCLog::BENCH);

                m_blockman.UnlinkPrunedFiles(setFilesToPrune);
            }
            m_last_write = nNow;
        }
        // Flush best chain related state. This can only be done if the blocks / block index write was also done.
        if (fDoFullFlush && !CoinsTip().GetBestBlock().IsNull()) {
            LOG_TIME_MILLIS_WITH_CATEGORY(strprintf("write coins cache to disk (%d coins, %.2fkB)",
                coins_count, coins_mem_usage / 1000), BCLog::BENCH);

            // Typical Coin structures on disk are around 48 bytes in size.
            // Pushing a new one to the database can cause it to be written
            // twice (once in the log, and once in the tables). This is already
            // an overestimation, as most will delete an existing entry or
            // overwrite one. Still, use a conservative safety factor of 2.
            if (!CheckDiskSpace(m_chainman.m_options.datadir, 48 * 2 * 2 * CoinsTip().GetCacheSize())) {
                return FatalError(m_chainman.GetNotifications(), state, _("Disk space is too low!"));
            }
            // Flush the chainstate (which may refer to block index entries).
            const auto empty_cache{(mode == FlushStateMode::ALWAYS) || fCacheLarge || fCacheCritical};
            if (empty_cache ? !CoinsTip().Flush() : !CoinsTip().Sync()) {
                return FatalError(m_chainman.GetNotifications(), state, _("Failed to write to coin database."));
            }
            m_last_flush = nNow;
            full_flush_completed = true;
            TRACE5(utxocache, flush,
                   int64_t{Ticks<std::chrono::microseconds>(SteadyClock::now() - nNow)},
                   (uint32_t)mode,
                   (uint64_t)coins_count,
                   (uint64_t)coins_mem_usage,
                   (bool)fFlushForPrune);
        }
    }
    if (full_flush_completed && m_chainman.m_options.signals) {
        // Update best block in wallet (so we can detect restored wallets).
        m_chainman.m_options.signals->ChainStateFlushed(this->GetRole(), m_chain.GetLocator());
    }
    } catch (const std::runtime_error& e) {
        return FatalError(m_chainman.GetNotifications(), state, strprintf(_("System error while flushing: %s"), e.what()));
    }
    return true;
}